

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O2

int archive_read_support_filter_lzma(archive *_a)

{
  int iVar1;
  
  iVar1 = __archive_read_register_bidder((archive_read *)_a,(void *)0x0,"lzma",&lzma_bidder_vtable);
  if (iVar1 != 0) {
    iVar1 = -0x1e;
  }
  return iVar1;
}

Assistant:

int
archive_read_support_filter_lzma(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;

	if (__archive_read_register_bidder(a, NULL, "lzma",
				&lzma_bidder_vtable) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

#if HAVE_LZMA_H && HAVE_LIBLZMA
	return (ARCHIVE_OK);
#else
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external lzma program for lzma decompression");
	return (ARCHIVE_WARN);
#endif
}